

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O3

IterateResult __thiscall
gl3cts::SparseBuffersWithCopyOpsTest::iterate(SparseBuffersWithCopyOpsTest *this)

{
  uchar *puVar1;
  uchar *puVar2;
  ostringstream *this_00;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  long lVar7;
  bool bVar8;
  uint uVar9;
  char *pcVar10;
  int iVar11;
  bool bVar12;
  uint uVar13;
  qpTestResult testResult;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  bVar3 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_buffer");
  testResult = QP_TEST_RESULT_PASS;
  if (bVar3) {
    bVar3 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_buffer_storage");
    if (bVar3) {
      bVar3 = initTest(this);
      pcVar10 = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
      if (bVar3) {
        puVar1 = this->m_reference_data;
        uVar13 = this->m_n_iterations_to_run;
        bVar12 = false;
        bVar3 = true;
        do {
          bVar8 = bVar3;
          bVar3 = uVar13 != 0;
          uVar13 = 0;
          if (bVar3) {
            uVar9 = 0;
            do {
              if (uVar9 != 0) {
                (**(code **)(lVar6 + 0x158))(0x8892,0,this->m_page_size * this->m_n_pages_to_test,0)
                ;
                dVar5 = (**(code **)(lVar6 + 0x800))();
                glu::checkError(dVar5,"glBufferPageCommitmentARB() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                                ,0x161b);
              }
              (**(code **)(lVar6 + 0x158))(0x8892,0,(long)this->m_page_size,1);
              dVar5 = (**(code **)(lVar6 + 0x800))();
              glu::checkError(dVar5,"glBufferPageCommitmentARB() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                              ,0x1620);
              (**(code **)(lVar6 + 0x168))(0x8892,0,0x10,puVar1);
              dVar5 = (**(code **)(lVar6 + 0x800))();
              glu::checkError(dVar5,"glBufferSubData() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                              ,0x1624);
              if (this->m_n_pages_to_test != 0) {
                iVar4 = this->m_page_size;
                uVar13 = 0;
                do {
                  (**(code **)(lVar6 + 0x158))(0x8892,iVar4 * uVar13,(long)iVar4,1);
                  dVar5 = (**(code **)(lVar6 + 0x800))();
                  glu::checkError(dVar5,"glBufferPageCommitmentARB() call failed.",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                                  ,0x162b);
                  for (iVar11 = (uint)(uVar13 == 0) << 4; iVar4 = this->m_page_size, iVar11 < iVar4;
                      iVar11 = iVar11 + 0x10) {
                    iVar4 = iVar4 * uVar13;
                    if (bVar12) {
                      (**(code **)(lVar6 + 0x168))(0x8892,iVar4 + iVar11,0x10,puVar1);
                      dVar5 = (**(code **)(lVar6 + 0x800))();
                      pcVar10 = "glBufferSubData() call failed.";
                      iVar4 = 0x1644;
                    }
                    else {
                      (**(code **)(lVar6 + 0x308))
                                (0x8892,0x8892,iVar11 + iVar4 + -0x10,iVar11 + iVar4,0x10);
                      dVar5 = (**(code **)(lVar6 + 0x800))();
                      pcVar10 = "glCopyBufferSubData() call failed.";
                      iVar4 = 0x163b;
                    }
                    glu::checkError(dVar5,pcVar10,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                                    ,iVar4);
                  }
                  uVar13 = uVar13 + 1;
                } while (uVar13 < this->m_n_pages_to_test);
              }
              (**(code **)(lVar6 + 0x308))(0x8892,0x8893,0,0,this->m_result_data_storage_size);
              dVar5 = (**(code **)(lVar6 + 0x800))();
              glu::checkError(dVar5,"glCopyBufferSubData() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                              ,0x1653);
              lVar7 = (**(code **)(lVar6 + 0xd00))
                                (0x8893,0,this->m_n_pages_to_test * this->m_page_size,1);
              dVar5 = (**(code **)(lVar6 + 0x800))();
              glu::checkError(dVar5,"glMapBufferRange() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                              ,0x1659);
              if (0xf < this->m_result_data_storage_size) {
                uVar14 = 0;
                do {
                  puVar2 = (uchar *)(lVar7 + uVar14);
                  auVar15[0] = -(*puVar2 == *puVar1);
                  auVar15[1] = -(puVar2[1] == this->m_reference_data[1]);
                  auVar15[2] = -(puVar2[2] == this->m_reference_data[2]);
                  auVar15[3] = -(puVar2[3] == this->m_reference_data[3]);
                  auVar15[4] = -(puVar2[4] == this->m_reference_data[4]);
                  auVar15[5] = -(puVar2[5] == this->m_reference_data[5]);
                  auVar15[6] = -(puVar2[6] == this->m_reference_data[6]);
                  auVar15[7] = -(puVar2[7] == this->m_reference_data[7]);
                  auVar15[8] = -(puVar2[8] == this->m_reference_data[8]);
                  auVar15[9] = -(puVar2[9] == this->m_reference_data[9]);
                  auVar15[10] = -(puVar2[10] == this->m_reference_data[10]);
                  auVar15[0xb] = -(puVar2[0xb] == this->m_reference_data[0xb]);
                  auVar15[0xc] = -(puVar2[0xc] == this->m_reference_data[0xc]);
                  auVar15[0xd] = -(puVar2[0xd] == this->m_reference_data[0xd]);
                  auVar15[0xe] = -(puVar2[0xe] == this->m_reference_data[0xe]);
                  auVar15[0xf] = -(puVar2[0xf] == this->m_reference_data[0xf]);
                  if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                               (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                               (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                               (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                               (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                               (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                               (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                               (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                               (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                               (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                               (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                               (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                               (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                               (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                              (ushort)(auVar15[0xf] >> 7) << 0xf) != 0xffff) {
                    local_1b0._0_8_ =
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                    this_00 = (ostringstream *)(local_1b0 + 8);
                    std::__cxx11::ostringstream::ostringstream(this_00);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,"Invalid data found for page index [",0x23);
                    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)this_00,"], BO data offset:[",0x13);
                    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"].",2);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_1b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    std::__cxx11::ostringstream::~ostringstream(this_00);
                    std::ios_base::~ios_base(local_138);
                    testResult = QP_TEST_RESULT_FAIL;
                    pcVar10 = "Fail";
                    goto LAB_00a852cf;
                  }
                  uVar14 = uVar14 + 0x10;
                } while ((this->m_result_data_storage_size & 0xfffffff0) != uVar14);
              }
              (**(code **)(lVar6 + 0x1670))(0x8893);
              dVar5 = (**(code **)(lVar6 + 0x800))();
              glu::checkError(dVar5,"glUnmapBuffer() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                              ,0x1671);
              (**(code **)(lVar6 + 0x168))
                        (0x8893,0,this->m_result_data_storage_size,this->m_clear_buffer);
              dVar5 = (**(code **)(lVar6 + 0x800))();
              glu::checkError(dVar5,"glBufferSubData() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                              ,0x1677);
              (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[5])();
              uVar9 = uVar9 + 1;
              uVar13 = this->m_n_iterations_to_run;
            } while (uVar9 < uVar13);
          }
          testResult = QP_TEST_RESULT_PASS;
          bVar12 = true;
          bVar3 = false;
        } while (bVar8);
        pcVar10 = "Pass";
      }
      goto LAB_00a852cf;
    }
  }
  pcVar10 = "Pass";
LAB_00a852cf:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,pcVar10);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SparseBuffersWithCopyOpsTest::iterate()
{
	bool result = true;

	/* Execute the test */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Only execute if we're dealing with an OpenGL implementation which supports both:
	 *
	 * 1. GL_ARB_sparse_buffer extension
	 * 2. GL_ARB_buffer_storage extension
	 */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_buffer") ||
		!m_context.getContextInfo().isExtensionSupported("GL_ARB_buffer_storage"))
	{
		goto end;
	}

	/* Set up the test objects */
	if (!initTest())
	{
		result = false;

		goto end;
	}
	for (unsigned int n_test_case = 0; n_test_case < 2; ++n_test_case)
	{
		for (unsigned int n_iteration = 0; n_iteration < m_n_iterations_to_run; ++n_iteration)
		{
			if (n_iteration != 0)
			{
				gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, 0, /* offset */
										   m_n_pages_to_test * m_page_size, GL_FALSE);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferPageCommitmentARB() call failed.");
			}

			gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, 0, /* offset */
									   m_page_size, GL_TRUE);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferPageCommitmentARB() call failed.");

			gl.bufferSubData(GL_ARRAY_BUFFER, 0, /* offset */
							 sizeof(m_reference_data), m_reference_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

			for (unsigned int n_page = 0; n_page < m_n_pages_to_test; ++n_page)
			{
				/* Try committing pages in a redundant manner. This is a legal behavior in light of
				 * the GL_ARB_sparse_buffer spec */
				gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, n_page * m_page_size, m_page_size, GL_TRUE);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferPageCommitmentARB() call failed.");

				for (int copy_dst_page_offset = static_cast<int>((n_page == 0) ? sizeof(m_reference_data) : 0);
					 copy_dst_page_offset < static_cast<int>(m_page_size);
					 copy_dst_page_offset += static_cast<int>(sizeof(m_reference_data)))
				{
					const int copy_src_page_offset =
						static_cast<const int>(copy_dst_page_offset - sizeof(m_reference_data));

					switch (n_test_case)
					{
					case 0:
					{
						gl.copyBufferSubData(GL_ARRAY_BUFFER, GL_ARRAY_BUFFER,
											 n_page * m_page_size + copy_src_page_offset,
											 n_page * m_page_size + copy_dst_page_offset, sizeof(m_reference_data));
						GLU_EXPECT_NO_ERROR(gl.getError(), "glCopyBufferSubData() call failed.");

						break;
					}

					case 1:
					{
						gl.bufferSubData(GL_ARRAY_BUFFER, n_page * m_page_size + copy_dst_page_offset,
										 sizeof(m_reference_data), m_reference_data);
						GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

						break;
					}

					default:
						TCU_FAIL("Unrecognized test case index");
					} /* switch (n_test_case) */
				}	 /* for (all valid destination copy op offsets) */
			}		  /* for (all test pages) */

			/* Copy data from the sparse buffer to a mappable immutable buffer storage */
			gl.copyBufferSubData(GL_ARRAY_BUFFER, GL_ELEMENT_ARRAY_BUFFER, 0, /* readOffset */
								 0,											  /* writeOffset */
								 m_result_data_storage_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCopyBufferSubData() call failed.");

			/* Map the data we have obtained */
			char* mapped_data = (char*)gl.mapBufferRange(GL_ELEMENT_ARRAY_BUFFER, 0, /* offset */
														 m_page_size * m_n_pages_to_test, GL_MAP_READ_BIT);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

			/* Verify the data is valid */
			for (unsigned int n_temp_copy = 0; n_temp_copy < m_result_data_storage_size / sizeof(m_reference_data);
				 ++n_temp_copy)
			{
				const unsigned int cmp_offset = static_cast<const unsigned int>(n_temp_copy * sizeof(m_reference_data));

				if (memcmp(mapped_data + cmp_offset, m_reference_data, sizeof(m_reference_data)) != 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data found for page index "
																   "["
									   << (cmp_offset / m_page_size) << "]"
																		", BO data offset:"
																		"["
									   << cmp_offset << "]." << tcu::TestLog::EndMessage;

					result = false;
					goto end;
				}
			} /* for (all datasets) */

			/* Clean up */
			gl.unmapBuffer(GL_ELEMENT_ARRAY_BUFFER);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

			/* Also, zero out the other buffer object we copy the result data to, in case
			 * the glCopyBufferSubData() call does not modify it at all */
			gl.bufferSubData(GL_ELEMENT_ARRAY_BUFFER, 0, /* offset */
							 m_result_data_storage_size, m_clear_buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

			/* NOTE: This test passes fine on the misbehaving driver *if* the swapbuffers operation
			 *       issued as a part of the call below is not executed. */
			m_context.getRenderContext().postIterate();
		} /* for (all test iterations) */
	}	 /* for (all test cases) */

end:
	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}